

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt_GetGlyphSVG(stbtt_fontinfo *info,int gl,char **svg)

{
  uchar *puVar1;
  uchar *puVar2;
  uint uVar3;
  
  uVar3 = 0;
  if (info->svg != 0) {
    puVar1 = info->data;
    puVar2 = stbtt_FindSVGDoc(info,gl);
    uVar3 = 0;
    if (puVar2 != (uchar *)0x0) {
      uVar3 = *(uint *)(puVar2 + 4);
      *svg = (char *)(puVar1 + (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 |
                                       (uVar3 & 0xff00) << 8 | uVar3 << 0x18) + (long)info->svg);
      uVar3 = *(uint *)(puVar2 + 8);
      uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    }
  }
  return uVar3;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphSVG(const stbtt_fontinfo *info, int gl, const char **svg)
{
   stbtt_uint8 *data = info->data;
   stbtt_uint8 *svg_doc;

   if (info->svg == 0)
      return 0;

   svg_doc = stbtt_FindSVGDoc(info, gl);
   if (svg_doc != NULL) {
      *svg = (char *) data + info->svg + ttULONG(svg_doc + 4);
      return ttULONG(svg_doc + 8);
   } else {
      return 0;
   }
}